

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::(anonymous_namespace)::UnknownFieldSetTest_Fixed64_Test>::
CreateTest(TestFactoryImpl<google::protobuf::(anonymous_namespace)::UnknownFieldSetTest_Fixed64_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x398);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__UnknownFieldSetTest_018c30f0;
  proto2_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)&this_00[1].gtest_flag_saver_,(Arena *)0x0);
  this_00[0x35].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&this_00[0x36].gtest_flag_saver_;
  this_00[0x36]._vptr_Test = (_func_int **)0x0;
  *(undefined1 *)
   &this_00[0x36].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  proto2_unittest::TestEmptyMessage::TestEmptyMessage
            ((TestEmptyMessage *)&this_00[0x37].gtest_flag_saver_,(Arena *)0x0);
  this_00->_vptr_Test = (_func_int **)&PTR__UnknownFieldSetTest_018c1bb8;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }